

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_strauss_state state;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_fe aux [8];
  secp256k1_scalar *in_stack_fffffffffffffcd8;
  secp256k1_scalar *in_stack_fffffffffffffce0;
  secp256k1_gej *in_stack_fffffffffffffce8;
  size_t in_stack_fffffffffffffcf0;
  secp256k1_gej *in_stack_fffffffffffffcf8;
  secp256k1_strauss_state *in_stack_fffffffffffffd00;
  
  secp256k1_ecmult_strauss_wnaf
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}